

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::CheckResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                 *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags,
                SHADER_RESOURCE_VARIABLE_TYPE_FLAGS *StaleVarTypes)

{
  SHADER_RESOURCE_VARIABLE_TYPE_FLAGS SVar1;
  int iVar2;
  PipelineResourceDesc *pPVar3;
  IDeviceObject *pIVar4;
  undefined4 extraout_var;
  Uint32 ArrInd;
  uint ArrayIndex;
  
  pPVar3 = GetDesc(this);
  SVar1 = 1 << (pPVar3->VarType & 0x1f);
  if (((Flags >> (pPVar3->VarType & 0x1f) & 1) != 0) &&
     ((*StaleVarTypes & SVar1) == SHADER_RESOURCE_VARIABLE_TYPE_FLAG_NONE)) {
    for (ArrayIndex = 0; ArrayIndex < pPVar3->ArraySize; ArrayIndex = ArrayIndex + 1) {
      pIVar4 = ShaderVariableManagerGL::TextureBindInfo::Get((TextureBindInfo *)this,ArrayIndex);
      if (pIVar4 == (IDeviceObject *)0x0) {
        if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0) goto LAB_002e4dd1;
        if (pResourceMapping != (IResourceMapping *)0x0) goto LAB_002e4dac;
      }
      else if (pResourceMapping != (IResourceMapping *)0x0 &&
               (char)((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) >> 3) == '\0') {
LAB_002e4dac:
        iVar2 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                          (pResourceMapping,pPVar3->Name,(ulong)ArrayIndex);
        if ((IDeviceObject *)CONCAT44(extraout_var,iVar2) != (IDeviceObject *)0x0 &&
            (IDeviceObject *)CONCAT44(extraout_var,iVar2) != pIVar4) {
LAB_002e4dd1:
          *StaleVarTypes = *StaleVarTypes | SVar1;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CheckResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags, SHADER_RESOURCE_VARIABLE_TYPE_FLAGS& StaleVarTypes) const
    {
        const ThisImplType* const   pThis   = static_cast<const ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        const SHADER_RESOURCE_VARIABLE_TYPE_FLAGS VarTypeFlag = static_cast<SHADER_RESOURCE_VARIABLE_TYPE_FLAGS>(1u << ResDesc.VarType);
        if ((Flags & VarTypeFlag) == 0)
            return; // This variable type is not being processed

        if ((StaleVarTypes & VarTypeFlag) != 0)
            return; // This variable type is already stale

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const IDeviceObject* const pBoundObj = pThis->Get(ArrInd);
            if ((pBoundObj != nullptr) && (Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0)
                continue;

            if ((pBoundObj == nullptr) && (Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) != 0)
            {
                StaleVarTypes |= VarTypeFlag;
                return;
            }

            if (pResourceMapping != nullptr)
            {
                if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
                {
                    if (pObj != pBoundObj)
                    {
                        StaleVarTypes |= VarTypeFlag;
                        return;
                    }
                }
            }
        }
    }